

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayoutInfo::unnest(QDockAreaLayoutInfo *this,int index)

{
  QDockAreaLayoutInfo *pQVar1;
  ulong uVar2;
  Data *pDVar3;
  pointer pQVar4;
  iterator iVar5;
  long i;
  
  i = (long)index;
  pQVar4 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  pQVar1 = pQVar4[i].subinfo;
  if ((pQVar1 != (QDockAreaLayoutInfo *)0x0) && (uVar2 = (pQVar1->item_list).d.size, uVar2 < 2)) {
    if (uVar2 == 0) {
      QList<QDockAreaLayoutItem>::removeAt(&this->item_list,i);
      return;
    }
    pQVar4 = pQVar4 + i;
    iVar5 = QList<QDockAreaLayoutItem>::begin(&pQVar1->item_list);
    if ((iVar5.i)->widgetItem == (QLayoutItem *)0x0) {
      if ((iVar5.i)->subinfo != (QDockAreaLayoutInfo *)0x0) {
        pQVar1 = pQVar4->subinfo;
        pQVar4->subinfo = (iVar5.i)->subinfo;
        (iVar5.i)->subinfo = (QDockAreaLayoutInfo *)0x0;
        QList<QDockAreaLayoutItem>::clear(&pQVar1->item_list);
        if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
          ~QDockAreaLayoutInfo(pQVar1);
        }
        operator_delete(pQVar1,0x70);
        return;
      }
    }
    else {
      pQVar4->widgetItem = (iVar5.i)->widgetItem;
      pQVar1 = pQVar4->subinfo;
      if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&(pQVar1->item_list).d);
        pDVar3 = (pQVar1->separatorWidgets).d.d;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar1->separatorWidgets).d.d)->super_QArrayData,8,0x10);
          }
        }
      }
      operator_delete(pQVar1,0x70);
      pQVar4->subinfo = (QDockAreaLayoutInfo *)0x0;
    }
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::unnest(int index)
{
    QDockAreaLayoutItem &item = item_list[index];
    if (item.subinfo == nullptr)
        return;
    if (item.subinfo->item_list.size() > 1)
        return;

    if (item.subinfo->item_list.size() == 0) {
        item_list.removeAt(index);
    } else if (item.subinfo->item_list.size() == 1) {
        QDockAreaLayoutItem &child = item.subinfo->item_list.first();
        if (child.widgetItem != nullptr) {
            item.widgetItem = child.widgetItem;
            delete item.subinfo;
            item.subinfo = nullptr;
        } else if (child.subinfo != nullptr) {
            QDockAreaLayoutInfo *tmp = item.subinfo;
            item.subinfo = child.subinfo;
            child.subinfo = nullptr;
            tmp->item_list.clear();
            delete tmp;
        }
    }
}